

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O0

FT_Error cff_builder_add_contour(CFF_Builder *builder)

{
  FT_Outline *pFVar1;
  int local_28;
  FT_Error error;
  FT_Outline *outline;
  CFF_Builder *builder_local;
  
  pFVar1 = builder->current;
  if (builder->load_points == '\0') {
    pFVar1->n_contours = pFVar1->n_contours + 1;
    builder_local._4_4_ = 0;
  }
  else {
    if (builder->loader->max_contours <
        (int)(builder->loader->base).outline.n_contours +
        (int)(builder->loader->current).outline.n_contours + 1U) {
      local_28 = FT_GlyphLoader_CheckPoints(builder->loader,0,1);
    }
    else {
      local_28 = 0;
    }
    if (local_28 == 0) {
      if (0 < pFVar1->n_contours) {
        pFVar1->contours[pFVar1->n_contours + -1] = pFVar1->n_points + -1;
      }
      pFVar1->n_contours = pFVar1->n_contours + 1;
    }
    builder_local._4_4_ = local_28;
  }
  return builder_local._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  cff_builder_add_contour( CFF_Builder*  builder )
  {
    FT_Outline*  outline = builder->current;
    FT_Error     error;


    if ( !builder->load_points )
    {
      outline->n_contours++;
      return FT_Err_Ok;
    }

    error = FT_GLYPHLOADER_CHECK_POINTS( builder->loader, 0, 1 );
    if ( !error )
    {
      if ( outline->n_contours > 0 )
        outline->contours[outline->n_contours - 1] =
          (short)( outline->n_points - 1 );

      outline->n_contours++;
    }

    return error;
  }